

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptl.cpp
# Opt level: O0

void __thiscall pg::PTLSolver::PTLSolver(PTLSolver *this,Oink *oink,Game *game)

{
  Game *game_local;
  Oink *oink_local;
  PTLSolver *this_local;
  
  Solver::Solver(&this->super_Solver,oink,game);
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__PTLSolver_0029cb68;
  this->multiplayer = true;
  this->iterations = 0;
  this->dominions = 0;
  this->tangles = 0;
  std::vector<int_*,_std::allocator<int_*>_>::vector(&this->tout);
  std::vector<int_*,_std::allocator<int_*>_>::vector(&this->tv);
  std::vector<int,_std::allocator<int>_>::vector(&this->tpr);
  uintqueue::uintqueue(&this->Q);
  uintqueue::uintqueue(&this->SolvedQ0);
  uintqueue::uintqueue(&this->SolvedQ1);
  uintqueue::uintqueue(&this->Zvec);
  uintqueue::uintqueue(&this->pea_vS);
  uintqueue::uintqueue(&this->pea_iS);
  uintqueue::uintqueue(&this->pea_S);
  bitset::bitset(&this->pea_root);
  std::vector<int,_std::allocator<int>_>::vector(&this->tangle);
  uintqueue::uintqueue(&this->tangleto);
  bitset::bitset(&this->bs_exits);
  bitset::bitset(&this->H);
  bitset::bitset(&this->G);
  bitset::bitset(&this->S0);
  bitset::bitset(&this->S1);
  std::__cxx11::string::string((string *)&this->path);
  return;
}

Assistant:

PTLSolver::PTLSolver(Oink& oink, Game& game) : Solver(oink, game)
{
}